

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O2

int __thiscall Js::BigUInt::DivRem(BigUInt *this,BigUInt *pbi)

{
  uint uVar1;
  code *pcVar2;
  uint32 uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  uint32 lu2;
  uint32 local_3c;
  uint local_38;
  uint32 luT;
  uint32 luLo;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1c1,"(pbi)","pbi");
    if (!bVar4) goto LAB_0060a15a;
    *puVar7 = 0;
  }
  uVar5 = 1;
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1c2,"(this != pbi)","this != pbi");
    if (!bVar4) goto LAB_0060a15a;
    *puVar7 = 0;
  }
  uVar1 = pbi->m_clu;
  uVar8 = (ulong)uVar1;
  iVar6 = this->m_clu;
  if ((int)uVar1 < iVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1cb,"(m_clu <= clu)","m_clu <= clu");
    if (!bVar4) goto LAB_0060a15a;
    *puVar7 = 0;
    iVar6 = this->m_clu;
  }
  if ((int)uVar1 < 1) {
    return 0;
  }
  if (iVar6 < (int)uVar1) {
    return 0;
  }
  luT = this->m_prglu[uVar1 - 1] / (pbi->m_prglu[uVar1 - 1] + 1);
  if (9 < luT) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1d1,"(wQuo >= 0 && wQuo <= 9)","wQuo >= 0 && wQuo <= 9");
    if (!bVar4) goto LAB_0060a15a;
    *puVar7 = 0;
  }
  if (luT == 0) {
LAB_0060a0c3:
    iVar6 = Compare(this,pbi);
    if (-1 < iVar6) {
      luT = luT + 1;
      if (iVar6 == 0) {
        this->m_clu = 0;
      }
      else {
        Subtract(this,pbi);
      }
    }
  }
  else {
    if (luT == 1) {
      Subtract(this,pbi);
      goto LAB_0060a0c3;
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    lu2 = 0;
    for (lVar9 = 0; uVar8 * 4 != lVar9; lVar9 = lVar9 + 4) {
      if (1 < uVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                    ,0x1e0,"(wCarry == 0 || wCarry == 1)",
                                    "wCarry == 0 || wCarry == 1");
        if (!bVar4) goto LAB_0060a15a;
        *puVar7 = 0;
      }
      local_38 = NumberUtilities::MulLu(luT,*(uint32 *)((long)pbi->m_prglu + lVar9),&local_3c);
      uVar3 = local_3c;
      iVar6 = NumberUtilities::AddLu(&local_38,lu2);
      if ((local_38 != 0) || (uVar5 == 0)) {
        uVar5 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar9),uVar5 + ~local_38);
      }
      lu2 = iVar6 + uVar3;
    }
    if (uVar5 != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x1ea,"(1 == wCarry)","1 == wCarry");
      if (!bVar4) goto LAB_0060a15a;
      *puVar7 = 0;
    }
    iVar6 = uVar1 + 1;
    do {
      if ((long)uVar8 < 1) {
        iVar6 = 0;
        break;
      }
      iVar6 = iVar6 + -1;
      lVar9 = uVar8 - 1;
      uVar8 = uVar8 - 1;
    } while (this->m_prglu[lVar9] == 0);
    this->m_clu = iVar6;
    if ((int)luT < 9) goto LAB_0060a0c3;
  }
  iVar6 = Compare(this,pbi);
  if (-1 < iVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1fc,"(Compare(pbi) < 0)","Compare(pbi) < 0");
    if (!bVar4) {
LAB_0060a15a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return luT;
}

Assistant:

int BigUInt::DivRem(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 ilu, clu;
        int wCarry;
        int wQuo;
        int wT;
        uint32 luT, luHi, luLo;

        clu = pbi->m_clu;
        Assert(m_clu <= clu);
        if ((m_clu < clu) || (clu <= 0))
            return 0;

        // Get a lower bound on the quotient.
        wQuo = (int)(m_prglu[clu - 1] / (pbi->m_prglu[clu - 1] + 1));
        Assert(wQuo >= 0 && wQuo <= 9);

        // Handle 0 and 1 as special cases.
        switch (wQuo)
        {
        case 0:
            break;
        case 1:
            Subtract(pbi);
            break;
        default:
            luHi = 0;
            wCarry = 1;
            for (ilu = 0; ilu < clu; ilu++)
            {
                Assert(wCarry == 0 || wCarry == 1);

                // Compute the product.
                luLo = NumberUtilities::MulLu(wQuo, pbi->m_prglu[ilu], &luT);
                luHi = luT + NumberUtilities::AddLu(&luLo, luHi);

                // Subtract the product. See note in BigInt::Subtract.
                if (0 != luLo || 0 == wCarry)
                    wCarry = NumberUtilities::AddLu(&m_prglu[ilu], ~luLo + wCarry);
            }
            Assert(1 == wCarry);
            Assert(ilu == clu);

            // Trim off zeros.
            while (--ilu >= 0 && 0 == m_prglu[ilu])
                ;
            m_clu = ilu + 1;
        }

        if (wQuo < 9 && (wT = Compare(pbi)) >= 0)
        {
            // Quotient was off too small (by one).
            wQuo++;
            if (wT == 0)
                m_clu = 0;
            else
                Subtract(pbi);
        }
        Assert(Compare(pbi) < 0);

        return wQuo;
    }